

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

double __thiscall smf::MidiFile::linearTickInterpolationAtSecond(MidiFile *this,double seconds)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  double xi;
  double y2;
  double y1;
  double x2;
  double x1;
  int startindex;
  double lasttime;
  int i;
  double seconds_local;
  MidiFile *this_local;
  
  if (((this->m_timemapvalid & 1U) == 0) && (buildTimeMap(this), (this->m_timemapvalid & 1U) == 0))
  {
    this_local = (MidiFile *)0xbff0000000000000;
  }
  else {
    sVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size(&this->m_timemap);
    pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                       (&this->m_timemap,sVar5 - 1);
    dVar1 = pvVar6->seconds;
    if (0.0 <= seconds) {
      sVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size(&this->m_timemap);
      pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                         (&this->m_timemap,sVar5 - 1);
      if (seconds < pvVar6->seconds || seconds == pvVar6->seconds) {
        x1._4_4_ = -1;
        if (dVar1 / 2.0 <= seconds) {
          sVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size
                            (&this->m_timemap);
          iVar3 = (int)sVar5;
          do {
            lasttime._4_4_ = iVar3 + -1;
            iVar4 = x1._4_4_;
            if ((lasttime._4_4_ < 1) ||
               (pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                                   (&this->m_timemap,(long)lasttime._4_4_), iVar4 = iVar3,
               pvVar6->seconds < seconds)) goto LAB_0015471d;
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttime._4_4_);
            iVar3 = lasttime._4_4_;
          } while ((pvVar6->seconds != seconds) || (NAN(pvVar6->seconds) || NAN(seconds)));
          x1._4_4_ = lasttime._4_4_;
          iVar4 = x1._4_4_;
        }
        else {
          for (lasttime._4_4_ = 0;
              sVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size
                                (&this->m_timemap), iVar4 = x1._4_4_, lasttime._4_4_ < (int)sVar5;
              lasttime._4_4_ = lasttime._4_4_ + 1) {
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttime._4_4_);
            if (seconds < pvVar6->seconds) {
              iVar4 = lasttime._4_4_ + -1;
              break;
            }
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttime._4_4_);
            if ((pvVar6->seconds == seconds) && (!NAN(pvVar6->seconds) && !NAN(seconds))) {
              x1._4_4_ = lasttime._4_4_;
              iVar4 = x1._4_4_;
              break;
            }
          }
        }
LAB_0015471d:
        x1._4_4_ = iVar4;
        if (x1._4_4_ < 0) {
          this_local = (MidiFile *)0xbff0000000000000;
        }
        else {
          sVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size
                            (&this->m_timemap);
          if (x1._4_4_ < (int)sVar5 + -1) {
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)x1._4_4_);
            dVar1 = pvVar6->seconds;
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)(x1._4_4_ + 1));
            dVar2 = pvVar6->seconds;
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)x1._4_4_);
            iVar3 = pvVar6->tick;
            pvVar6 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)(x1._4_4_ + 1));
            this_local = (MidiFile *)
                         ((seconds - dVar1) *
                          (((double)pvVar6->tick - (double)iVar3) / (dVar2 - dVar1)) + (double)iVar3
                         );
          }
          else {
            this_local = (MidiFile *)0xbff0000000000000;
          }
        }
      }
      else {
        this_local = (MidiFile *)0xbff0000000000000;
      }
    }
    else {
      this_local = (MidiFile *)0xbff0000000000000;
    }
  }
  return (double)this_local;
}

Assistant:

double MidiFile::linearTickInterpolationAtSecond(double seconds) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}

	int i;
	double lasttime = m_timemap[m_timemap.size()-1].seconds;
	// give an error value of -1 if time is out of range of data.
	if (seconds < 0.0) {
		return -1.0;
	}
	if (seconds > m_timemap[m_timemap.size()-1].seconds) {
		return -1.0;
	}

	// Guess which side of the list is closest to target:
	// Could do a more efficient algorithm since time values are sorted,
	// but good enough for now...
	int startindex = -1;
	if (seconds < lasttime / 2) {
		for (i=0; i<(int)m_timemap.size(); i++) {
			if (m_timemap[i].seconds > seconds) {
				startindex = i-1;
				break;
			} else if (m_timemap[i].seconds == seconds) {
				startindex = i;
				break;
			}
		}
	} else {
		for (i=(int)m_timemap.size()-1; i>0; i--) {
			if (m_timemap[i].seconds < seconds) {
				startindex = i+1;
				break;
			} else if (m_timemap[i].seconds == seconds) {
				startindex = i;
				break;
			}
		}
	}

	if (startindex < 0) {
		return -1.0;
	}
	if (startindex >= (int)m_timemap.size()-1) {
		return -1.0;
	}

	double x1 = m_timemap[startindex].seconds;
	double x2 = m_timemap[startindex+1].seconds;
	double y1 = m_timemap[startindex].tick;
	double y2 = m_timemap[startindex+1].tick;
	double xi = seconds;

	return (xi-x1) * ((y2-y1)/(x2-x1)) + y1;
}